

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# etdc_test.c
# Opt level: O2

int firstpass(etdc_table **table,uint *input,int size)

{
  int iVar1;
  long lVar2;
  ulong uVar3;
  ulong uVar4;
  double dVar5;
  
  startTimer();
  uVar3 = 0;
  uVar4 = (ulong)(uint)size;
  if (size < 1) {
    uVar4 = uVar3;
  }
  for (; uVar4 != uVar3; uVar3 = uVar3 + 1) {
    etdc_add(table,input[uVar3]);
  }
  startTimer();
  etdc_sort(table);
  startTimer();
  etdc_gencodes(*table);
  dVar5 = timeFromBegin();
  lVar2 = realTimeFromBegin();
  printf("generating = %lf (%ld) \n",dVar5,lVar2);
  iVar1 = etdc_size(*table);
  return iVar1;
}

Assistant:

int firstpass(struct etdc_table **table, unsigned int *input, int size) {
  int i;

  //adding symbols to hash table

  startTimer();
  for(i = 0; i < size; i++) {
    etdc_add(table, input[i]);
  }
  //printf("add hashtable time = %lf (%ld) \n", timeFromBegin(), realTimeFromBegin());

  //sorting by frequency (high values first)

  startTimer();
  etdc_sort(table);
  //printf("sorting hashtable time = %lf (%ld) \n", timeFromBegin(), realTimeFromBegin());

  //generate codes
  startTimer();
  etdc_gencodes(*table);
  printf("generating = %lf (%ld) \n", timeFromBegin(), realTimeFromBegin());

  return etdc_size(*table);
}